

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O0

int set_float_attr(attr_list list,atom_t attr_id,double fvalue)

{
  attr_union value;
  int iVar1;
  double in_XMM0_Qa;
  attr_union tmp;
  attr_value_type t;
  attr_list in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffd4 [12];
  
  value.u._4_12_ = in_stack_ffffffffffffffd4;
  value.u.f = (float)in_XMM0_Qa;
  iVar1 = set_pattr(in_stack_ffffffffffffffc8,0,0x1058f7,value);
  return iVar1;
}

Assistant:

extern int
set_float_attr(attr_list list, atom_t attr_id, double fvalue)
{
    attr_value_type t = Attr_Float4;
    attr_union tmp;
    tmp.u.f = (float) fvalue;
    if (sizeof(float) == 8) t = Attr_Float8;
    if (sizeof(float) == 16) t = Attr_Float16;
    return set_pattr(list, attr_id, t, tmp);
}